

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-inl.h
# Opt level: O3

void __thiscall
wabt::interp::RefPtr<wabt::interp::Func>::RefPtr
          (RefPtr<wabt::interp::Func> *this,Store *store,Ref ref)

{
  ObjectKind OVar1;
  ExternKind EVar2;
  Object *pOVar3;
  Func *pFVar4;
  GlobalType *expected;
  Result RVar5;
  Index IVar6;
  GlobalType *in_RCX;
  undefined8 *extraout_RDX;
  interp *this_00;
  undefined8 *in_R8;
  char *pcVar7;
  string sStack_b0;
  vector<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_> vStack_90;
  RefPtr<wabt::interp::Trap> RStack_70;
  Ref local_20;
  
  pOVar3 = (store->objects_).list_.
           super__Vector_base<wabt::interp::Object_*,_std::allocator<wabt::interp::Object_*>_>.
           _M_impl.super__Vector_impl_data._M_start[ref.index];
  if (((ulong)pOVar3 & 1) == 0) {
    OVar1 = pOVar3->kind_;
    this_00 = (interp *)(long)(int)OVar1;
    if ((OVar1 & ~Foreign) != DefinedFunc) {
      if (ref.index == 0) {
        this_00 = (interp *)0x0;
      }
      interp::RefPtr(this_00);
      expected = (GlobalType *)extraout_RDX[8];
      EVar2 = (expected->super_ExternType).kind;
      if (expected == (GlobalType *)0x0 || (ulong)EVar2 != 3) {
        if (EVar2 < (Last|Table)) {
          pcVar7 = (char *)(&g_kind_name)[EVar2];
        }
        else {
          pcVar7 = "<error_kind>";
        }
        StringPrintf_abi_cxx11_
                  (&sStack_b0,"expected import \"%s.%s\" to have kind %s, not %s",*extraout_RDX,
                   extraout_RDX[4],pcVar7,DAT_00243958);
        vStack_90.super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        vStack_90.super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        vStack_90.super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        Store::
        Alloc<wabt::interp::Trap,wabt::interp::Store&,std::__cxx11::string_const&,std::vector<wabt::interp::Frame,std::allocator<wabt::interp::Frame>>const&>
                  (&RStack_70,store,store,&sStack_b0,&vStack_90);
        *in_R8 = RStack_70.obj_;
        in_R8[1] = RStack_70.store_;
        in_R8[2] = RStack_70.root_index_;
        RStack_70.root_index_ = 0;
        RStack_70.obj_ = (Trap *)0x0;
        RStack_70.store_ = (Store *)0x0;
        if (vStack_90.super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(vStack_90.
                          super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)vStack_90.
                                super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)vStack_90.
                                super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)sStack_b0._M_dataplus._M_p != &sStack_b0.field_2) {
          operator_delete(sStack_b0._M_dataplus._M_p,
                          CONCAT71(sStack_b0.field_2._M_allocated_capacity._1_7_,
                                   sStack_b0.field_2._M_local_buf[0]) + 1);
        }
      }
      else {
        sStack_b0._M_string_length = 0;
        sStack_b0.field_2._M_local_buf[0] = '\0';
        sStack_b0._M_dataplus._M_p = (pointer)&sStack_b0.field_2;
        RVar5 = Match(expected,in_RCX,&sStack_b0);
        if (RVar5.enum_ == Error) {
          vStack_90.super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          vStack_90.super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          vStack_90.super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          Store::
          Alloc<wabt::interp::Trap,wabt::interp::Store&,std::__cxx11::string_const&,std::vector<wabt::interp::Frame,std::allocator<wabt::interp::Frame>>const&>
                    (&RStack_70,store,store,&sStack_b0,&vStack_90);
          *in_R8 = RStack_70.obj_;
          in_R8[1] = RStack_70.store_;
          in_R8[2] = RStack_70.root_index_;
          RStack_70.root_index_ = 0;
          RStack_70.obj_ = (Trap *)0x0;
          RStack_70.store_ = (Store *)0x0;
          if (vStack_90.
              super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(vStack_90.
                            super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)vStack_90.
                                  super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)vStack_90.
                                  super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)sStack_b0._M_dataplus._M_p != &sStack_b0.field_2) {
          operator_delete(sStack_b0._M_dataplus._M_p,
                          CONCAT71(sStack_b0.field_2._M_allocated_capacity._1_7_,
                                   sStack_b0.field_2._M_local_buf[0]) + 1);
        }
      }
      return;
    }
    local_20.index = ref.index;
    IVar6 = FreeList<wabt::interp::Ref>::New<wabt::interp::Ref&>(&store->roots_,&local_20);
    this->root_index_ = IVar6;
    pFVar4 = (Func *)(store->objects_).list_.
                     super__Vector_base<wabt::interp::Object_*,_std::allocator<wabt::interp::Object_*>_>
                     ._M_impl.super__Vector_impl_data._M_start[ref.index];
    if (((ulong)pFVar4 & 1) == 0) {
      this->obj_ = pFVar4;
      this->store_ = store;
      return;
    }
  }
  else if (ref.index == 0) {
    interp::RefPtr((interp *)0x0);
  }
  __assert_fail("IsUsed(index)",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/include/wabt/interp/interp-inl.h"
                ,0xe6,
                "T &wabt::interp::FreeList<wabt::interp::Object *>::Get(Index) [T = wabt::interp::Object *]"
               );
}

Assistant:

RefPtr<T>::RefPtr(Store& store, Ref ref) {
#ifndef NDEBUG
  if (!store.Is<T>(ref)) {
    ObjectKind ref_kind;
    if (ref == Ref::Null) {
      ref_kind = ObjectKind::Null;
    } else {
      ref_kind = store.objects_.Get(ref.index)->kind();
    }
    fprintf(stderr, "Invalid conversion from Ref (%s) to RefPtr<%s>!\n",
            GetName(ref_kind), T::GetTypeName());
    abort();
  }
#endif
  root_index_ = store.NewRoot(ref);
  obj_ = static_cast<T*>(store.objects_.Get(ref.index));
  store_ = &store;
}